

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_groupby.cpp
# Opt level: O3

void duckdb::CheckGroupingSetMax(idx_t count)

{
  ParserException *this;
  string local_40;
  
  if (count < 0x10000) {
    return;
  }
  this = (ParserException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Maximum grouping set count of %d exceeded","");
  ParserException::ParserException<unsigned_long>(this,&local_40,0xffff);
  __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void CheckGroupingSetMax(idx_t count) {
	static constexpr const idx_t MAX_GROUPING_SETS = 65535;
	if (count > MAX_GROUPING_SETS) {
		throw ParserException("Maximum grouping set count of %d exceeded", MAX_GROUPING_SETS);
	}
}